

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimation
          (OgreBinarySerializer *this,Skeleton *skeleton)

{
  pointer *pppAVar1;
  pointer *pppBVar2;
  StreamReader<false,_false> *pSVar3;
  iterator __position;
  unsigned_short uVar4;
  uint uVar5;
  Animation *this_00;
  Logger *this_01;
  int iVar6;
  Skeleton *__return_storage_ptr__;
  MemoryStreamReader *this_02;
  float fVar7;
  Animation *anim;
  Animation *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  Skeleton local_1a8 [2];
  ios_base local_138 [264];
  
  this_00 = (Animation *)operator_new(0x70);
  Animation::Animation(this_00,skeleton);
  __return_storage_ptr__ = local_1a8;
  local_1d0 = this_00;
  ReadLine_abi_cxx11_((string *)__return_storage_ptr__,this);
  std::__cxx11::string::operator=((string *)&this_00->name,(string *)__return_storage_ptr__);
  pppBVar2 = &local_1a8[0].bones.
              super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (local_1a8[0].bones.
      super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppBVar2) {
    __return_storage_ptr__ =
         (Skeleton *)
         ((long)local_1a8[0].bones.
                super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    operator_delete(local_1a8[0].bones.
                    super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,(ulong)__return_storage_ptr__);
  }
  fVar7 = StreamReader<false,_false>::Get<float>(this->m_reader);
  this_00->length = fVar7;
  pSVar3 = this->m_reader;
  if (*(int *)&pSVar3->end != *(int *)&pSVar3->current) {
    uVar4 = StreamReader<false,_false>::Get<unsigned_short>(pSVar3);
    uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar5;
    if (uVar4 == 0x4010) {
      __return_storage_ptr__ = local_1a8;
      ReadLine_abi_cxx11_((string *)__return_storage_ptr__,this);
      std::__cxx11::string::operator=((string *)&this_00->baseName,(string *)__return_storage_ptr__)
      ;
      if (local_1a8[0].bones.
          super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)pppBVar2) {
        __return_storage_ptr__ =
             (Skeleton *)
             ((long)local_1a8[0].bones.
                    super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        operator_delete(local_1a8[0].bones.
                        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)__return_storage_ptr__);
      }
      fVar7 = StreamReader<false,_false>::Get<float>(this->m_reader);
      this_00->baseTime = fVar7;
      uVar4 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
      uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
      this->m_currentLen = uVar5;
    }
    this_02 = this->m_reader;
    iVar6 = *(int *)&this_02->end - *(int *)&this_02->current;
    while ((uVar4 == 0x4100 && (iVar6 != 0))) {
      ReadSkeletonAnimationTrack(this,__return_storage_ptr__,this_00);
      pSVar3 = this->m_reader;
      if (*(int *)&pSVar3->end == *(int *)&pSVar3->current) goto LAB_0041fca5;
      uVar4 = StreamReader<false,_false>::Get<unsigned_short>(pSVar3);
      uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
      this->m_currentLen = uVar5;
      this_02 = this->m_reader;
      iVar6 = *(int *)&this_02->end - *(int *)&this_02->current;
    }
    if (iVar6 != 0) {
      StreamReader<false,_false>::IncPtr(this_02,-6);
    }
  }
LAB_0041fca5:
  __position._M_current =
       (skeleton->animations).
       super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (skeleton->animations).
      super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::Ogre::Animation*,std::allocator<Assimp::Ogre::Animation*>>::
    _M_realloc_insert<Assimp::Ogre::Animation*const&>
              ((vector<Assimp::Ogre::Animation*,std::allocator<Assimp::Ogre::Animation*>> *)
               &skeleton->animations,__position,&local_1d0);
  }
  else {
    *__position._M_current = local_1d0;
    pppAVar1 = &(skeleton->animations).
                super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[5]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [5])"    ");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(local_1d0->name)._M_dataplus._M_p,
             (local_1d0->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
  std::ostream::_M_insert<double>((double)local_1d0->length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," sec, ",6);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," tracks)",8);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_01,(char *)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimation(Skeleton *skeleton)
{
    Animation *anim = new Animation(skeleton);
    anim->name = ReadLine();
    anim->length = Read<float>();

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        if (id == SKELETON_ANIMATION_BASEINFO)
        {
            anim->baseName = ReadLine();
            anim->baseTime = Read<float>();

            // Advance to first track
            id = ReadHeader();
        }

        while (!AtEnd() && id == SKELETON_ANIMATION_TRACK)
        {
            ReadSkeletonAnimationTrack(skeleton, anim);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    skeleton->animations.push_back(anim);

    ASSIMP_LOG_DEBUG_F( "    ", anim->name, " (", anim->length, " sec, ", anim->tracks.size(), " tracks)");
}